

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

LONG __thiscall
CorUnix::CPalSynchronizationManager::DoMonitorProcesses
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  int iVar1;
  _MonitoredProcessesListNode *p_Var2;
  bool bVar3;
  MonitoredProcessesListNode *pMVar4;
  CProcProcessLocalData *pCVar5;
  MonitoredProcessesListNode **ppMVar6;
  MonitoredProcessesListNode *pMVar7;
  MonitoredProcessesListNode *pMVar8;
  int iVar9;
  
  InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
  iVar1 = this->m_lMonitoredProcessesCount;
  if (this->m_pmplnMonitoredProcesses == (MonitoredProcessesListNode *)0x0) {
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    pMVar7 = this->m_pmplnMonitoredProcesses;
    pMVar8 = (MonitoredProcessesListNode *)0x0;
    do {
      p_Var2 = pMVar7->pNext;
      bVar3 = HasProcessExited(pMVar7->dwPid,&pMVar7->dwExitCode,&pMVar7->fIsActualExitCode);
      pMVar4 = pMVar7;
      if (bVar3) {
        if (PAL_InitializeChakraCoreCalled == false) goto LAB_00347636;
        pMVar4 = pMVar8;
        if (pMVar8 == (MonitoredProcessesListNode *)0x0) {
          pMVar4 = (MonitoredProcessesListNode *)&this->m_pmplnMonitoredProcesses;
        }
        pMVar4->pNext = p_Var2;
        this->m_lMonitoredProcessesCount = this->m_lMonitoredProcessesCount + -1;
        pMVar7->pNext = this->m_pmplnExitedNodes;
        this->m_pmplnExitedNodes = pMVar7;
        iVar9 = iVar9 + 1;
        pMVar4 = pMVar8;
      }
      pMVar7 = p_Var2;
      pMVar8 = pMVar4;
    } while (p_Var2 != (_MonitoredProcessesListNode *)0x0);
    InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
    if (0 < iVar9) {
      AcquireLocalSynchLock(pthrCurrent);
      InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      ppMVar6 = &this->m_pmplnExitedNodes;
      pMVar7 = (MonitoredProcessesListNode *)ppMVar6;
      do {
        pMVar7 = pMVar7->pNext;
        if (pMVar7 == (MonitoredProcessesListNode *)0x0) goto LAB_00347566;
      } while (pMVar7->psdSynchData->m_odObjectDomain != SharedObject);
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      AcquireSharedSynchLock(pthrCurrent);
      InternalEnterCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
LAB_00347566:
      pMVar8 = *ppMVar6;
      *ppMVar6 = (MonitoredProcessesListNode *)0x0;
      while (pMVar8 != (MonitoredProcessesListNode *)0x0) {
        if (PAL_InitializeChakraCoreCalled == false) {
LAB_00347636:
          abort();
        }
        p_Var2 = pMVar8->pNext;
        if (pMVar8->fIsActualExitCode == false) {
          pCVar5 = pMVar8->pProcLocalData;
        }
        else {
          pCVar5 = pMVar8->pProcLocalData;
          *(DWORD *)(pCVar5 + 8) = pMVar8->dwExitCode;
        }
        *(undefined4 *)(pCVar5 + 4) = 3;
        CSynchData::SetSignalCount(pMVar8->psdSynchData,1);
        CSynchData::ReleaseAllLocalWaiters(pMVar8->psdSynchData,pthrCurrent);
        CSynchData::Release(pMVar8->psdSynchData,pthrCurrent);
        InternalFree(pMVar8);
        pMVar8 = p_Var2;
      }
      InternalLeaveCriticalSection(pthrCurrent,(PCRITICAL_SECTION)s_csMonitoredProcessesLock);
      if (pMVar7 != (MonitoredProcessesListNode *)0x0) {
        ReleaseSharedSynchLock(pthrCurrent);
      }
      ReleaseLocalSynchLock(pthrCurrent);
    }
  }
  return iVar1 - iVar9;
}

Assistant:

LONG CPalSynchronizationManager::DoMonitorProcesses(
        CPalThread * pthrCurrent)
    {
        MonitoredProcessesListNode * pNode, * pPrev = NULL, * pNext;
        LONG lInitialNodeCount;
        LONG lRemovingCount = 0;
        bool fLocalSynchLock = false;
        bool fSharedSynchLock = false;
        bool fMonitoredProcessesLock = false;

        // Note: we first need to grab the monitored processes lock to walk
        //       the list of monitored processes, and then, if there is any
        //       which exited, to grab the synchronization lock(s) to signal
        //       the process object. Anyway we cannot grab the synchronization
        //       lock(s) while holding the monitored processes lock; that
        //       would cause deadlock, since RegisterProcessForMonitoring and
        //       UnRegisterProcessForMonitoring call stacks grab the locks
        //       in the opposite order. Grabbing the synch lock(s) first (and
        //       therefore all the times) would cause unacceptable contention
        //       (process monitoring is done in polling mode).
        //       Therefore we need to remove list nodes for processes that
        //       exited copying them to the exited array, while holding only
        //       the monitored processes lock, and then to signal them from that
        //       array holding synch lock(s) and monitored processes lock,
        //       acquired in this order. Holding again the monitored processes
        //       lock is needed in order to support object promotion.

        // Grab the monitored processes lock
        InternalEnterCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = true;

        lInitialNodeCount = m_lMonitoredProcessesCount;

        pNode = m_pmplnMonitoredProcesses;
        while (pNode)
        {
            pNext = pNode->pNext;

            if (HasProcessExited(pNode->dwPid,
                                 &pNode->dwExitCode,
                                 &pNode->fIsActualExitCode))
            {
                TRACE("Process %u exited with return code %u\n",
                      pNode->dwPid,
                      pNode->fIsActualExitCode ? "actual" : "guessed",
                      pNode->dwExitCode);

                if (NULL != pPrev)
                {
                    pPrev->pNext = pNext;
                }
                else
                {
                    m_pmplnMonitoredProcesses = pNext;
                }
                m_lMonitoredProcessesCount--;

                // Insert in the list of nodes for exited processes
                pNode->pNext = m_pmplnExitedNodes;
                m_pmplnExitedNodes = pNode;
                lRemovingCount++;
            }
            else
            {
                pPrev = pNode;
            }

            // Go to the next
            pNode = pNext;
        }

        // Release the monitored processes lock
        InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        fMonitoredProcessesLock = false;

        if (lRemovingCount > 0)
        {
            // First grab the local synch lock
            AcquireLocalSynchLock(pthrCurrent);
            fLocalSynchLock = true;

            // Acquire the monitored processes lock
            InternalEnterCriticalSection(pthrCurrent,
                                         &s_csMonitoredProcessesLock);
            fMonitoredProcessesLock = true;

            if (!fSharedSynchLock)
            {
                bool fSharedSynchLockIsNeeded = false;

                // See if the shared lock is needed
                pNode = m_pmplnExitedNodes;
                while (pNode)
                {
                    if (SharedObject == pNode->psdSynchData->GetObjectDomain())
                    {
                        fSharedSynchLockIsNeeded = true;
                        break;
                    }

                    pNode = pNode->pNext;
                }

                if (fSharedSynchLockIsNeeded)
                {
                    // Release the monitored processes lock
                    InternalLeaveCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = false;

                    // Acquire the shared synch lock
                    AcquireSharedSynchLock(pthrCurrent);
                    fSharedSynchLock = true;

                    // Acquire again the monitored processes lock
                    InternalEnterCriticalSection(pthrCurrent,
                                                 &s_csMonitoredProcessesLock);
                    fMonitoredProcessesLock = true;
                }
            }

            // Start from the beginning of the exited processes list
            pNode = m_pmplnExitedNodes;

            // Invalidate the list
            m_pmplnExitedNodes = NULL;

            while (pNode)
            {
                pNext = pNode->pNext;

                TRACE("Process pid=%u exited with exitcode=%u\n",
                      pNode->dwPid, pNode->dwExitCode);

                // Store the exit code in the process local data
                if (pNode->fIsActualExitCode)
                {
                    pNode->pProcLocalData->dwExitCode = pNode->dwExitCode;
                }

                // Set process status to PS_DONE
                pNode->pProcLocalData->ps = PS_DONE;

                // Set signal count
                pNode->psdSynchData->SetSignalCount(1);

                // Releasing all local waiters
                //
                // We just called directly in CSynchData::SetSignalCount(), so
                // we need to take care of waking up waiting threads according
                // to the Process object semantics (i.e. every thread must be
                // awakend). Anyway if a process object is shared among two or
                // more processes and threads from different processes are
                // waiting on it, the object will be registered for monitoring
                // in each of the processes. As result its signal count will
                // be set to one more times (which is not a problem, given the
                // process object semantics) and each worker thread will wake
                // up waiting threads. Therefore we need to make sure that each
                // worker wakes up only threads in its own process: we do that
                // by calling ReleaseAllLocalWaiters
                pNode->psdSynchData->ReleaseAllLocalWaiters(pthrCurrent);

                // Release the reference to the SynchData
                pNode->psdSynchData->Release(pthrCurrent);

                // Delete the node
                InternalDelete(pNode);

                // Go to the next
                pNode = pNext;
            }
        }

        if (fMonitoredProcessesLock)
        {
            // Release the monitored processes lock
            InternalLeaveCriticalSection(pthrCurrent,
                                     &s_csMonitoredProcessesLock);
        }
        if (fSharedSynchLock)
        {
            // Release the shared synch lock
            ReleaseSharedSynchLock(pthrCurrent);
        }
        if (fLocalSynchLock)
        {
            // Release the local synch lock
            ReleaseLocalSynchLock(pthrCurrent);
        }

        return (lInitialNodeCount - lRemovingCount);
    }